

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O2

void __thiscall
Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::initializeSampleLists
          (TypedDeepImageChannel<Imath_3_2::half> *this)

{
  uint uVar1;
  ImageLevel *pIVar2;
  long lVar3;
  _func_int **pp_Var4;
  Vec2<int> VVar5;
  half **pphVar6;
  half *phVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (this->_sampleBuffer != (half *)0x0) {
    operator_delete__(this->_sampleBuffer);
  }
  this->_sampleBuffer = (half *)0x0;
  pIVar2 = (this->super_DeepImageChannel).super_ImageChannel._level;
  lVar3 = *(long *)&pIVar2[3]._xLevelNumber;
  pp_Var4 = pIVar2[4]._vptr_ImageLevel;
  VVar5 = pIVar2[4]._dataWindow.min;
  uVar9 = 0xffffffffffffffff;
  if (-1 < (long)VVar5) {
    uVar9 = (long)VVar5 * 2;
  }
  phVar7 = (half *)operator_new__(uVar9);
  this->_sampleBuffer = phVar7;
  (*(this->super_DeepImageChannel).super_ImageChannel._vptr_ImageChannel[9])();
  uVar9 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  for (uVar8 = 0; uVar8 < uVar9; uVar8 = uVar8 + 1) {
    this->_sampleListPointers[uVar8] = this->_sampleBuffer + (long)pp_Var4[uVar8];
    uVar1 = *(uint *)(lVar3 + uVar8 * 4);
    pphVar6 = this->_sampleListPointers;
    for (uVar10 = 0; uVar10 < uVar1; uVar10 = uVar10 + 1) {
      pphVar6[uVar8][uVar10]._h = 0;
    }
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::initializeSampleLists ()
{
    //
    // Allocate a new set of sample lists for this channel, and
    // construct zero-filled sample lists for the pixels.
    //

    delete[] _sampleBuffer;

    _sampleBuffer = 0; // set to 0 to prevent double deletion
                       // in case of an exception

    const unsigned int* numSamples    = sampleCounts ().numSamples ();
    const size_t* sampleListPositions = sampleCounts ().sampleListPositions ();

    _sampleBuffer = new T[sampleCounts ().sampleBufferSize ()];

    resetBasePointer ();

    for (size_t i = 0; i < numPixels (); ++i)
    {
        _sampleListPointers[i] = _sampleBuffer + sampleListPositions[i];

        for (unsigned int j = 0; j < numSamples[i]; ++j)
            _sampleListPointers[i][j] = T (0);
    }
}